

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  cmGeneratorTarget *this_02;
  string *psVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  string fc;
  string cleanfile;
  string currentBinDir;
  string cleanfilePath;
  ofstream fout;
  string local_320;
  cmLocalUnixMakefileGenerator3 *local_300;
  undefined1 local_2f8 [32];
  _Base_ptr local_2d8;
  size_t local_2d0;
  string local_2c8;
  string local_2a8;
  string local_288;
  char *local_268;
  cmGeneratorTarget *local_260;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_258;
  string local_250;
  undefined1 local_230 [16];
  _func_int *local_220 [2];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_258 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  pcVar2 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + psVar3->_M_string_length);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_288._M_dataplus._M_p,
             local_288._M_dataplus._M_p + local_288._M_string_length);
  std::__cxx11::string::append((char *)&local_2c8);
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
            (local_230,this,target);
  std::__cxx11::string::_M_append((char *)&local_2c8,local_230._0_8_);
  if ((_func_int **)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,(ulong)(local_220[0] + 1));
  }
  std::__cxx11::string::append((char *)&local_2c8);
  if (filename != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_2c8);
    std::__cxx11::string::append((char *)&local_2c8);
  }
  std::__cxx11::string::append((char *)&local_2c8);
  cmsys::SystemTools::CollapseFullPath(&local_250,&local_2c8);
  std::ofstream::ofstream(local_230,local_250._M_dataplus._M_p,_S_out);
  local_300 = this;
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                   "Could not create ",&local_250);
    cmSystemTools::Error((string *)local_2f8);
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  local_268 = filename;
  local_260 = target;
  if ((files->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"file(REMOVE_RECURSE\n",0x14);
    p_Var5 = (files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(files->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_2f8,(cmLocalGenerator *)local_300,&local_288,
                   (string *)(p_Var5 + 1));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"  ",2);
        cmOutputConverter::EscapeForCMake(&local_320,(string *)local_2f8);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,")\n",2);
  }
  local_2f8._0_8_ = local_2f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"$(CMAKE_COMMAND) -P ","");
  this_01 = local_300;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)local_300);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_2a8,(cmLocalGenerator *)this_01,psVar3,&local_2c8);
  cmOutputConverter::ConvertToOutputFormat
            (&local_320,
             &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_2a8,SHELL);
  std::__cxx11::string::_M_append(local_2f8,(ulong)local_320._M_dataplus._M_p);
  paVar1 = &local_320.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_258,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  this_02 = local_260;
  if (local_268 == (char *)0x0) {
    local_2f8._24_8_ = local_2f8 + 8;
    local_2f8._8_4_ = _S_red;
    local_2f8._16_8_ = 0;
    local_2d0 = 0;
    this_00 = (local_300->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_320._M_dataplus._M_p = (pointer)paVar1;
    local_2d8 = (_Base_ptr)local_2f8._24_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CMAKE_BUILD_TYPE","");
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_320);
    cmGeneratorTarget::GetLanguages
              (this_02,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f8,psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar1) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"# Per-language clean rules from dependency scanning.\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"foreach(lang ",0xd);
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_320,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8," ");
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,local_320._M_dataplus._M_p,local_320._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  include(",10);
    (*(local_300->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
              (&local_2a8,local_300,this_02);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"/cmake_clean_${lang}.cmake OPTIONAL)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"endforeach()\n",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar1) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2f8);
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinDir;
  cleanfile += "/";
  cleanfile += this->GetTargetDirectory(target);
  cleanfile += "/cmake_clean";
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
  cmsys::ofstream fout(cleanfilePath.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfilePath);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeConvertToRelativePath(currentBinDir, file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->GetCurrentBinaryDirectory(),
                                       cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}